

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator.cpp
# Opt level: O2

bool __thiscall duckdb::PhysicalOperator::AllSourcesSupportBatchIndex(PhysicalOperator *this)

{
  char cVar1;
  undefined8 *puVar2;
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> sources;
  undefined8 *local_60;
  undefined8 *local_58;
  undefined1 local_48 [8];
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  (*this->_vptr_PhysicalOperator[0x25])(&local_60,this);
  do {
    puVar2 = local_60;
    if (puVar2 == local_58) break;
    local_48[0] = 1;
    local_40._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_40._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_40._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cVar1 = (**(code **)(*(long *)*puVar2 + 0xa8))((long *)*puVar2,local_48);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_40);
    local_60 = puVar2 + 1;
  } while (cVar1 != '\0');
  std::
  _Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ::~_Vector_base((_Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
                   *)&local_60);
  return puVar2 == local_58;
}

Assistant:

bool PhysicalOperator::AllSourcesSupportBatchIndex() const {
	auto sources = GetSources();
	for (auto &source : sources) {
		if (!source.get().SupportsPartitioning(OperatorPartitionInfo::BatchIndex())) {
			return false;
		}
	}
	return true;
}